

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageProcessing.cpp
# Opt level: O0

Mat * preprocessImage(Mat *img,int numRows,int numCols)

{
  byte bVar1;
  uchar *puVar2;
  ulong uVar3;
  size_type sVar4;
  reference vec;
  int in_ECX;
  undefined4 in_register_00000034;
  Mat *this;
  bool bVar5;
  Mat local_8d0 [96];
  _OutputArray local_870;
  Size_<int> local_858;
  _OutputArray local_850;
  _InputArray local_838;
  Mat local_820 [8];
  Mat region;
  undefined1 local_7c0 [8];
  Rect rec;
  undefined1 local_794 [8];
  Rect bnd;
  uint i_1;
  double area;
  double areaprev;
  Rect prevb;
  _OutputArray local_758;
  _InputArray local_740;
  undefined1 local_728 [8];
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  countours;
  Mat realClone;
  Size_<int> local_6b0;
  _OutputArray local_6a8;
  _InputArray local_690;
  byte local_675;
  int local_674;
  uchar *puStack_670;
  int x;
  uchar *ptr;
  int local_660;
  int y;
  int startAtY;
  int startAtX;
  Mat local_4f8 [8];
  Mat newImg;
  int local_4ec;
  _InputArray local_498;
  double local_480 [4];
  Mat local_460 [8];
  Mat stub_3;
  Mat local_400 [96];
  _InputArray local_3a0;
  double local_388 [4];
  Mat local_368 [8];
  Mat stub_2;
  Mat local_308 [96];
  _InputArray local_2a8;
  double local_290 [4];
  Mat local_270 [8];
  Mat stub_1;
  Mat local_210 [96];
  _InputArray local_1b0;
  double local_198 [4];
  Mat local_178 [8];
  Mat stub;
  Mat local_108 [96];
  int local_a8;
  int local_a4;
  int i;
  int center;
  int thresholdRight;
  int thresholdLeft;
  int thresholdTop;
  int thresholdBottom;
  Mat temp;
  int local_30;
  int local_2c;
  int colRight;
  int colLeft;
  int rowBottom;
  int rowTop;
  int numCols_local;
  int numRows_local;
  Mat *img_local;
  Mat *cloneImg;
  
  this = (Mat *)CONCAT44(in_register_00000034,numRows);
  colLeft = -1;
  colRight = -1;
  local_2c = -1;
  local_30 = -1;
  cv::Mat::Mat((Mat *)&thresholdTop);
  thresholdLeft = 0x32;
  thresholdRight = 0x32;
  center = 0x32;
  i = 0x32;
  local_a8 = *(int *)(this + 8) / 2;
  local_a4 = local_a8;
  for (; local_a8 < *(int *)(this + 8); local_a8 = local_a8 + 1) {
    if (colRight == -1) {
      cv::Mat::row(local_108,numRows);
      cv::Mat::operator=((Mat *)&thresholdTop,local_108);
      cv::Mat::~Mat(local_108);
      cv::Mat::Mat(local_178,(Mat *)&thresholdTop);
      cv::_InputArray::_InputArray(&local_1b0,local_178);
      cv::sum((_InputArray *)local_198);
      bVar5 = true;
      if ((double)thresholdLeft <= local_198[0]) {
        bVar5 = local_a8 == *(int *)(this + 8) + -1;
      }
      cv::_InputArray::~_InputArray(&local_1b0);
      if (bVar5) {
        colRight = local_a8;
      }
      cv::Mat::~Mat(local_178);
    }
    if (colLeft == -1) {
      cv::Mat::row(local_210,numRows);
      cv::Mat::operator=((Mat *)&thresholdTop,local_210);
      cv::Mat::~Mat(local_210);
      cv::Mat::Mat(local_270,(Mat *)&thresholdTop);
      cv::_InputArray::_InputArray(&local_2a8,local_270);
      cv::sum((_InputArray *)local_290);
      bVar5 = true;
      if ((double)thresholdRight <= local_290[0]) {
        bVar5 = local_a8 == *(int *)(this + 8) + -1;
      }
      cv::_InputArray::~_InputArray(&local_2a8);
      if (bVar5) {
        colLeft = *(int *)(this + 8) - local_a8;
      }
      cv::Mat::~Mat(local_270);
    }
    if (local_30 == -1) {
      cv::Mat::col(local_308,numRows);
      cv::Mat::operator=((Mat *)&thresholdTop,local_308);
      cv::Mat::~Mat(local_308);
      cv::Mat::Mat(local_368,(Mat *)&thresholdTop);
      cv::_InputArray::_InputArray(&local_3a0,local_368);
      cv::sum((_InputArray *)local_388);
      bVar5 = true;
      if ((double)i <= local_388[0]) {
        bVar5 = local_a8 == *(int *)(this + 0xc) + -1;
      }
      cv::_InputArray::~_InputArray(&local_3a0);
      if (bVar5) {
        local_30 = local_a8;
      }
      cv::Mat::~Mat(local_368);
    }
    if (local_2c == -1) {
      cv::Mat::col(local_400,numRows);
      cv::Mat::operator=((Mat *)&thresholdTop,local_400);
      cv::Mat::~Mat(local_400);
      cv::Mat::Mat(local_460,(Mat *)&thresholdTop);
      cv::_InputArray::_InputArray(&local_498,local_460);
      cv::sum((_InputArray *)local_480);
      bVar5 = true;
      if ((double)center <= local_480[0]) {
        bVar5 = local_a8 == *(int *)(this + 0xc) + -1;
      }
      cv::_InputArray::~_InputArray(&local_498);
      if (bVar5) {
        local_2c = *(int *)(this + 0xc) - local_a8;
      }
      cv::Mat::~Mat(local_460);
    }
  }
  cv::Mat::Mat(local_4f8);
  cv::Mat::zeros((int)&startAtY,*(int *)(this + 8),*(int *)(this + 0xc));
  cv::Mat::operator=(local_4f8,(MatExpr *)&startAtY);
  cv::MatExpr::~MatExpr((MatExpr *)&startAtY);
  y = local_4ec / 2 - (local_30 - local_2c) / 2;
  ptr._4_4_ = _newImg / 2 - (colRight - colLeft) / 2;
  local_660 = ptr._4_4_;
  for (; ptr._4_4_ < _newImg / 2 + (colRight - colLeft) / 2; ptr._4_4_ = ptr._4_4_ + 1) {
    puStack_670 = cv::Mat::ptr<unsigned_char>(local_4f8,ptr._4_4_);
    for (local_674 = y; local_674 < local_4ec / 2 + (local_30 - local_2c) / 2;
        local_674 = local_674 + 1) {
      puVar2 = cv::Mat::at<unsigned_char>
                         (this,colLeft + (ptr._4_4_ - local_660),local_2c + (local_674 - y));
      puStack_670[local_674] = *puVar2;
    }
  }
  local_675 = 0;
  cv::Mat::Mat(img,numCols,in_ECX,0);
  cv::_InputArray::_InputArray(&local_690,local_4f8);
  cv::_OutputArray::_OutputArray(&local_6a8,img);
  cv::Size_<int>::Size_(&local_6b0,numCols,in_ECX);
  cv::resize(0,&local_690,&local_6a8,&local_6b0,0);
  cv::_OutputArray::~_OutputArray(&local_6a8);
  cv::_InputArray::~_InputArray(&local_690);
  cv::Mat::clone();
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            *)local_728);
  cv::_InputArray::_InputArray(&local_740,img);
  cv::_OutputArray::_OutputArray<cv::Point_<int>>
            (&local_758,
             (vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              *)local_728);
  cv::Point_<int>::Point_((Point_<int> *)&prevb.width);
  cv::findContours(&local_740,&local_758,1,2,&prevb.width);
  cv::_OutputArray::~_OutputArray(&local_758);
  cv::_InputArray::~_InputArray(&local_740);
  cv::Rect_<int>::Rect_((Rect_<int> *)&areaprev);
  area = 0.0;
  for (bnd.width = 0; uVar3 = (ulong)(uint)bnd.width,
      sVar4 = std::
              vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              ::size((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                      *)local_728), uVar3 < sVar4; bnd.width = bnd.width + 1) {
    vec = std::
          vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
          ::operator[]((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                        *)local_728,(ulong)(uint)bnd.width);
    cv::_InputArray::_InputArray<cv::Point_<int>>((_InputArray *)&rec.width,vec);
    cv::boundingRect((_InputArray *)local_794);
    cv::_InputArray::~_InputArray((_InputArray *)&rec.width);
    register0x00001200 = (double)(bnd.y * bnd.x);
    if (area < register0x00001200) {
      cv::Rect_<int>::operator=((Rect_<int> *)&areaprev,(Rect_<int> *)local_794);
      area = stack0xfffffffffffff880;
    }
  }
  cv::Rect_<int>::Rect_((Rect_<int> *)local_7c0,(Rect_<int> *)&areaprev);
  cv::Mat::operator()(local_820,
                      (Rect *)&countours.
                               super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar1 = cv::Mat::empty();
  if ((bVar1 & 1) == 0) {
    cv::_InputArray::_InputArray(&local_838,local_820);
    cv::_OutputArray::_OutputArray(&local_850,img);
    cv::Size_<int>::Size_(&local_858,numCols,in_ECX);
    cv::resize(0,&local_838,&local_850,&local_858,0);
    cv::_OutputArray::~_OutputArray(&local_850);
    cv::_InputArray::~_InputArray(&local_838);
  }
  cv::_OutputArray::_OutputArray(&local_870,img);
  cv::Mat::convertTo((_OutputArray *)img,(int)&local_870,0.00392156862745098,0.0);
  cv::_OutputArray::~_OutputArray(&local_870);
  cv::Mat::reshape((int)local_8d0,(int)img);
  cv::Mat::operator=(img,local_8d0);
  cv::Mat::~Mat(local_8d0);
  local_675 = 1;
  cv::Mat::~Mat(local_820);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             *)local_728);
  cv::Mat::~Mat((Mat *)&countours.
                        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((local_675 & 1) == 0) {
    cv::Mat::~Mat(img);
  }
  cv::Mat::~Mat(local_4f8);
  cv::Mat::~Mat((Mat *)&thresholdTop);
  return img;
}

Assistant:

Mat preprocessImage(Mat img, int numRows, int numCols)
{

    
    int rowTop=-1, rowBottom=-1, colLeft=-1, colRight=-1;

    Mat temp;
    int thresholdBottom = 50;
    int thresholdTop = 50;
    int thresholdLeft = 50;
    int thresholdRight = 50;
    int center = img.rows/2;
    for(int i=center;i<img.rows;i++){
        if(rowBottom==-1)
        {
            temp = img.row(i);
            Mat stub = temp;
            if(sum(stub).val[0] < thresholdBottom || i==img.rows-1)
                rowBottom = i;

        }

        if(rowTop==-1)
        {
            temp = img.row(img.rows-i);
            Mat stub = temp;
            if(sum(stub).val[0] < thresholdTop || i==img.rows-1)
                rowTop = img.rows-i;

        }
        if(colRight==-1)
        {
            temp = img.col(i);
            Mat stub = temp;
            if(sum(stub).val[0] < thresholdRight|| i==img.cols-1)
                colRight = i;

        }

        if(colLeft==-1)
        {
            temp = img.col(img.cols-i);
            Mat stub = temp;
            if(sum(stub).val[0] < thresholdLeft|| i==img.cols-1)
                colLeft = img.cols-i;
        }
    }
    Mat newImg;
    //newImg = img.clone();

    newImg = newImg.zeros(img.rows, img.cols, CV_8UC1);

    int startAtX = (newImg.cols/2)-(colRight-colLeft)/2;

    int startAtY = (newImg.rows/2)-(rowBottom-rowTop)/2;

    for(int y=startAtY;y<(newImg.rows/2)+(rowBottom-rowTop)/2;y++)
    {
        uchar *ptr = newImg.ptr<uchar>(y);
        for(int x=startAtX;x<(newImg.cols/2)+(colRight-colLeft)/2;x++)
        {
            ptr[x] = img.at<uchar>(rowTop+(y-startAtY),colLeft+(x-startAtX));
        }
    }
    Mat cloneImg = Mat(numRows, numCols, CV_8UC1);
    resize(newImg, cloneImg, Size(numRows, numCols), 0, 0 , INTER_NEAREST);
    // Now fill along the borders
    /*for(int i=0;i<cloneImg.rows;i++)
    {
        floodFill(cloneImg, Point(0, i), Scalar(0,0,0));

        floodFill(cloneImg, Point(cloneImg.cols-1, i), Scalar(0,0,0));

        floodFill(cloneImg, Point(i, 0), Scalar(0));
        floodFill(cloneImg, Point(i, cloneImg.rows-1), Scalar(0));
    }*/
    Mat realClone = cloneImg.clone();
    vector<vector<Point>> countours;
    findContours(cloneImg, countours, RETR_LIST, CHAIN_APPROX_SIMPLE);
    Rect prevb; double areaprev = 0; double area; 
    for(unsigned int i = 0; i<countours.size();i++){
        Rect bnd = boundingRect(countours[i]);
        area = bnd.height*bnd.width;
        if(area > areaprev){
            prevb = bnd;
            areaprev = area;
        }
    }
    Rect rec = prevb;
    Mat region = realClone(rec);
    if(!region.empty())
        resize(region, cloneImg, Size(numRows, numCols), 0, 0, INTER_NEAREST);   

    cloneImg.convertTo(cloneImg, CV_32FC1, 1.0/255.0 );
    //imshow("clone img", cloneImg);
    //waitKey(0);
    cloneImg = cloneImg.reshape(1,1);
    return cloneImg;
}